

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudEncoder::EncodePointAttributes(PointCloudEncoder *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference piVar5;
  pointer pAVar6;
  __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
  *in_RDI;
  int att_encoder_id_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  int att_encoder_id;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *att_enc;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
  *__range1;
  PointCloudEncoder *in_stack_000001b8;
  vector<int,_std::allocator<int>_> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  uchar *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
  *local_40;
  reference local_38;
  unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *local_30;
  __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
  *local_20;
  undefined1 local_11;
  bool local_1;
  
  uVar3 = (*(code *)in_RDI->_M_current[8]._M_t.
                    super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl)();
  if ((uVar3 & 1) == 0) {
    local_1 = false;
  }
  else {
    this_00 = (vector<int,_std::allocator<int>_> *)in_RDI[0xb]._M_current;
    sVar4 = std::
            vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                    *)(in_RDI + 2));
    local_11 = (undefined1)sVar4;
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0);
    local_20 = in_RDI + 2;
    local_28._M_current =
         (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *)
         std::
         vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
         ::begin((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  *)this_00);
    local_30 = (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)std::
                  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  ::end((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                         *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
                                      *)this_00), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
                 ::operator*(&local_28);
      pAVar6 = std::
               unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                             *)0x1aecaf);
      uVar2 = (*pAVar6->_vptr_AttributesEncoder[2])(pAVar6,in_RDI,in_RDI[1]._M_current);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_*,_std::vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>_>
      ::operator++(&local_28);
    }
    bVar1 = RearrangeAttributesEncoders(in_stack_000001b8);
    if (bVar1) {
      local_40 = in_RDI + 8;
      local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
      std::vector<int,_std::allocator<int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)this_00), bVar1) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_48);
        uVar3 = (*(code *)in_RDI->_M_current[10]._M_t.
                          super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl)
                          (in_RDI,*piVar5);
        if ((uVar3 & 1) == 0) {
          return false;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_48);
      }
      local_68._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
      std::vector<int,_std::allocator<int>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)this_00), bVar1) {
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_68);
        std::
        vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
        ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      *)(in_RDI + 2),(long)*piVar5);
        pAVar6 = std::
                 unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                               *)0x1aede6);
        uVar2 = (*pAVar6->_vptr_AttributesEncoder[3])(pAVar6,in_RDI[0xb]._M_current);
        if ((uVar2 & 1) == 0) {
          return false;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_68);
      }
      uVar3 = (*(code *)in_RDI->_M_current[0xb]._M_t.
                        super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl)();
      if ((uVar3 & 1) == 0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool PointCloudEncoder::EncodePointAttributes() {
  if (!GenerateAttributesEncoders()) {
    return false;
  }

  // Encode the number of attribute encoders.
  buffer_->Encode(static_cast<uint8_t>(attributes_encoders_.size()));

  // Initialize all the encoders (this is used for example to init attribute
  // dependencies, no data is encoded in this step).
  for (auto &att_enc : attributes_encoders_) {
    if (!att_enc->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Rearrange attributes to respect dependencies between individual attributes.
  if (!RearrangeAttributesEncoders()) {
    return false;
  }

  // Encode any data that is necessary to create the corresponding attribute
  // decoder.
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!EncodeAttributesEncoderIdentifier(att_encoder_id)) {
      return false;
    }
  }

  // Also encode any attribute encoder data (such as the info about encoded
  // attributes).
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributesEncoderData(
            buffer_)) {
      return false;
    }
  }

  // Lastly encode all the attributes using the provided attribute encoders.
  if (!EncodeAllAttributes()) {
    return false;
  }
  return true;
}